

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O0

int64_t c_v128_dotp_s32(c_v128 a,c_v128 b)

{
  c_v128 b_local;
  c_v128 a_local;
  
  a_local.u32[3] = a.u32[3];
  b_local.u32[3] = b.u32[3];
  a_local.u32[2] = a.u32[2];
  b_local.u32[2] = b.u32[2];
  a_local.u32[1] = a.u32[1];
  b_local.u32[1] = b.u32[1];
  a_local.u32[0] = a.u32[0];
  b_local.u32[0] = b.u32[0];
  return (long)(int)(a_local.u32[3] * b_local.u32[3]) + (long)(int)(a_local.u32[2] * b_local.u32[2])
         + (long)(int)(a_local.u32[1] * b_local.u32[1]) +
         (long)(int)(a_local.u32[0] * b_local.u32[0]);
}

Assistant:

SIMD_INLINE int64_t c_v128_dotp_s32(c_v128 a, c_v128 b) {
  // 32 bit products, 64 bit sum
  return (int64_t)(int32_t)((int64_t)a.s32[3] * b.s32[3]) +
         (int64_t)(int32_t)((int64_t)a.s32[2] * b.s32[2]) +
         (int64_t)(int32_t)((int64_t)a.s32[1] * b.s32[1]) +
         (int64_t)(int32_t)((int64_t)a.s32[0] * b.s32[0]);
}